

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexData(MeshGeometry *this,string *type,int index,Scope *source)

{
  pointer *ppiVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  Element *pEVar6;
  Token *pTVar7;
  const_iterator cVar8;
  Token *t;
  Token *t_00;
  long lVar9;
  Token *t_01;
  uint *puVar10;
  string local_1e8;
  string local_1c8;
  vector<int,_std::allocator<int>_> temp_materials;
  ios_base local_138 [264];
  
  ppiVar1 = &temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppiVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&temp_materials,"MappingInformationType","");
  pEVar6 = GetRequiredElement(source,(string *)&temp_materials,(Element *)0x0);
  pTVar7 = GetRequiredToken(pEVar6,0);
  ParseTokenAsString_abi_cxx11_(&local_1c8,(FBX *)pTVar7,t);
  if ((pointer *)
      temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != ppiVar1) {
    operator_delete(temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppiVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&temp_materials,"ReferenceInformationType","");
  pEVar6 = GetRequiredElement(source,(string *)&temp_materials,(Element *)0x0);
  pTVar7 = GetRequiredToken(pEVar6,0);
  ParseTokenAsString_abi_cxx11_(&local_1e8,(FBX *)pTVar7,t_00);
  if ((pointer *)
      temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != ppiVar1) {
    operator_delete(temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar5 = std::__cxx11::string::compare((char *)type);
  if (iVar5 == 0) {
    if (index < 8) {
      temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppiVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&temp_materials,"Name","");
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                      *)source,(key_type *)&temp_materials);
      if ((_Rb_tree_header *)cVar8._M_node == &(source->elements)._M_t._M_impl.super__Rb_tree_header
         ) {
        pEVar6 = (Element *)0x0;
      }
      else {
        pEVar6 = *(Element **)(cVar8._M_node + 2);
      }
      if ((pointer *)
          temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != ppiVar1) {
        operator_delete(temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::__cxx11::string::_M_replace
                ((ulong)(this->m_uvNames + index),0,(char *)this->m_uvNames[index]._M_string_length,
                 0x22ba1d);
      if (pEVar6 != (Element *)0x0) {
        pTVar7 = GetRequiredToken(pEVar6,0);
        ParseTokenAsString_abi_cxx11_((string *)&temp_materials,(FBX *)pTVar7,t_01);
        std::__cxx11::string::operator=
                  ((string *)(this->m_uvNames + index),(string *)&temp_materials);
        if ((pointer *)
            temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != ppiVar1) {
          operator_delete(temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      ResolveVertexDataArray<aiVector2t<float>>
                (this->m_uvs + index,source,&local_1c8,&local_1e8,"UV","UVIndex",
                 ((long)(this->m_vertices).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_vertices).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
                 &this->m_mapping_counts,&this->m_mapping_offsets,&this->m_mappings);
      goto LAB_0018f18c;
    }
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[60]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &temp_materials,
               (char (*) [60])"ignoring UV layer, maximum number of UV channels exceeded: ");
    std::ostream::operator<<((ostream *)&temp_materials,index);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&temp_materials," (limit is ",0xb)
    ;
    std::ostream::operator<<((ostream *)&temp_materials,8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&temp_materials,")",1);
    LogFunctions<Assimp::FBXImporter>::LogError((format *)&temp_materials);
LAB_0018ef5a:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&temp_materials);
    std::ios_base::~ios_base(local_138);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)type);
    if (iVar5 == 0) {
      if ((this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        ReadVertexDataMaterials(this,&temp_materials,source,&local_1c8,&local_1e8);
        lVar9 = 0;
        for (puVar10 = (uint *)temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
            puVar10 !=
            (uint *)temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
          lVar9 = lVar9 + (ulong)(*puVar10 >> 0x1f);
        }
        if (lVar9 == (long)temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) {
          LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x18f07f);
        }
        else {
          piVar2 = (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar4 = (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = piVar2;
          temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3;
          temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = piVar4;
        }
        if (temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        goto LAB_0018f18c;
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)type);
      if (iVar5 == 0) {
        if ((this->m_normals).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->m_normals).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ResolveVertexDataArray<aiVector3t<float>>
                    (&this->m_normals,source,&local_1c8,&local_1e8,"Normals","NormalsIndex",
                     ((long)(this->m_vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
                     &this->m_mapping_counts,&this->m_mapping_offsets,&this->m_mappings);
          goto LAB_0018f18c;
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)type);
        if (iVar5 == 0) {
          if ((this->m_tangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (this->m_tangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ReadVertexDataTangents(this,&this->m_tangents,source,&local_1c8,&local_1e8);
            goto LAB_0018f18c;
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)type);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare((char *)type);
            if (iVar5 != 0) goto LAB_0018f18c;
            if (index < 8) {
              ReadVertexDataColors(this,this->m_colors + index,source,&local_1c8,&local_1e8);
              goto LAB_0018f18c;
            }
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[69]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &temp_materials,
                       (char (*) [69])
                       "ignoring vertex color layer, maximum number of color sets exceeded: ");
            std::ostream::operator<<((ostream *)&temp_materials,index);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&temp_materials," (limit is ",0xb);
            std::ostream::operator<<((ostream *)&temp_materials,8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&temp_materials,")",1);
            LogFunctions<Assimp::FBXImporter>::LogError((format *)&temp_materials);
            goto LAB_0018ef5a;
          }
          if ((this->m_binormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (this->m_binormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ReadVertexDataBinormals(this,&this->m_binormals,source,&local_1c8,&local_1e8);
            goto LAB_0018f18c;
          }
        }
      }
    }
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x18f18c);
  }
LAB_0018f18c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MeshGeometry::ReadVertexData(const std::string& type, int index, const Scope& source)
{
    const std::string& MappingInformationType = ParseTokenAsString(GetRequiredToken(
        GetRequiredElement(source,"MappingInformationType"),0)
    );

    const std::string& ReferenceInformationType = ParseTokenAsString(GetRequiredToken(
        GetRequiredElement(source,"ReferenceInformationType"),0)
    );

    if (type == "LayerElementUV") {
        if(index >= AI_MAX_NUMBER_OF_TEXTURECOORDS) {
            FBXImporter::LogError(Formatter::format("ignoring UV layer, maximum number of UV channels exceeded: ")
                << index << " (limit is " << AI_MAX_NUMBER_OF_TEXTURECOORDS << ")" );
            return;
        }

        const Element* Name = source["Name"];
        m_uvNames[index] = "";
        if(Name) {
            m_uvNames[index] = ParseTokenAsString(GetRequiredToken(*Name,0));
        }

        ReadVertexDataUV(m_uvs[index],source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementMaterial") {
        if (m_materials.size() > 0) {
            FBXImporter::LogError("ignoring additional material layer");
            return;
        }

        std::vector<int> temp_materials;

        ReadVertexDataMaterials(temp_materials,source,
            MappingInformationType,
            ReferenceInformationType
        );

        // sometimes, there will be only negative entries. Drop the material
        // layer in such a case (I guess it means a default material should
        // be used). This is what the converter would do anyway, and it
        // avoids losing the material if there are more material layers
        // coming of which at least one contains actual data (did observe
        // that with one test file).
        const size_t count_neg = std::count_if(temp_materials.begin(),temp_materials.end(),[](int n) { return n < 0; });
        if(count_neg == temp_materials.size()) {
            FBXImporter::LogWarn("ignoring dummy material layer (all entries -1)");
            return;
        }

        std::swap(temp_materials, m_materials);
    }
    else if (type == "LayerElementNormal") {
        if (m_normals.size() > 0) {
            FBXImporter::LogError("ignoring additional normal layer");
            return;
        }

        ReadVertexDataNormals(m_normals,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementTangent") {
        if (m_tangents.size() > 0) {
            FBXImporter::LogError("ignoring additional tangent layer");
            return;
        }

        ReadVertexDataTangents(m_tangents,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementBinormal") {
        if (m_binormals.size() > 0) {
            FBXImporter::LogError("ignoring additional binormal layer");
            return;
        }

        ReadVertexDataBinormals(m_binormals,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementColor") {
        if(index >= AI_MAX_NUMBER_OF_COLOR_SETS) {
            FBXImporter::LogError(Formatter::format("ignoring vertex color layer, maximum number of color sets exceeded: ")
                << index << " (limit is " << AI_MAX_NUMBER_OF_COLOR_SETS << ")" );
            return;
        }

        ReadVertexDataColors(m_colors[index],source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
}